

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_GLMClassifier_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::GLMClassifier_DoubleArray>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::GLMClassifier_DoubleArray> *)
             _GLMClassifier_DoubleArray_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::GLMClassifier>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::GLMClassifier> *)
             _GLMClassifier_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _GLMClassifier_DoubleArray_default_instance_.Shutdown();
  _GLMClassifier_default_instance_.Shutdown();
}